

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_wav_init_memory(void *pData,size_t dataSize,ma_decoding_backend_config *pConfig,
                            ma_allocation_callbacks *pAllocationCallbacks,ma_wav *pWav)

{
  ma_bool32 mVar1;
  void *in_RCX;
  ma_wav *in_RDX;
  ma_decoding_backend_config *in_RSI;
  ma_wav *in_R8;
  ma_bool32 wavResult;
  ma_result result;
  uint in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  local_4 = ma_wav_init_internal(in_RSI,in_RDX);
  if (local_4 == MA_SUCCESS) {
    mVar1 = ma_dr_wav_init_memory
                      ((ma_dr_wav *)in_RDX,in_RCX,(size_t)in_R8,
                       (ma_allocation_callbacks *)(ulong)in_stack_ffffffffffffffc8);
    if (mVar1 == 1) {
      ma_wav_post_init(in_R8);
      local_4 = MA_SUCCESS;
    }
    else {
      local_4 = MA_INVALID_FILE;
    }
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_wav_init_memory(const void* pData, size_t dataSize, const ma_decoding_backend_config* pConfig, const ma_allocation_callbacks* pAllocationCallbacks, ma_wav* pWav)
{
    ma_result result;

    result = ma_wav_init_internal(pConfig, pWav);
    if (result != MA_SUCCESS) {
        return result;
    }

    #if !defined(MA_NO_WAV)
    {
        ma_bool32 wavResult;

        wavResult = ma_dr_wav_init_memory(&pWav->dr, pData, dataSize, pAllocationCallbacks);
        if (wavResult != MA_TRUE) {
            return MA_INVALID_FILE;
        }

        ma_wav_post_init(pWav);

        return MA_SUCCESS;
    }
    #else
    {
        /* wav is disabled. */
        (void)pData;
        (void)dataSize;
        (void)pAllocationCallbacks;
        return MA_NOT_IMPLEMENTED;
    }
    #endif
}